

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

optional<unsigned_long> __thiscall wasm::WATParser::Lexer::takeI<unsigned_long>(Lexer *this)

{
  pointer pAVar1;
  bool bVar2;
  _Storage<unsigned_long,_true> _Var3;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  string_view in;
  optional<unsigned_long> oVar5;
  undefined1 local_40 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> result;
  
  in = next(this);
  _Var3 = (_Storage<unsigned_long,_true>)
          anon_unknown_0::integer
                    ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_40,in);
  if (result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
      _M_payload._M_value.sign._0_1_ == '\x01') {
    _Var3._M_value._4_4_ = 0;
    _Var3._M_value._0_4_ =
         result.
         super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
         _M_payload.
         super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
         _M_payload._M_value.n._0_4_;
    if (result.
        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
        _M_payload.
        super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
        _M_payload._M_value.n._0_4_ != 0) {
      bVar2 = -1 < (long)result.
                         super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                         ._M_payload._M_value.super_LexResult.span._M_str;
      if (result.
          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
          _M_payload.
          super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
          _M_payload._M_value.n._0_4_ == 2) {
        bVar2 = (long)result.
                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                      ._M_payload._M_value.super_LexResult.span._M_str < 1;
      }
      if (!bVar2) goto LAB_00b7f0eb;
    }
    this->pos = this->pos + (long)local_40;
    pAVar1 = (this->annotations).
             super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->annotations).
        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        ._M_impl.super__Vector_impl_data._M_finish != pAVar1) {
      (this->annotations).
      super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>.
      _M_impl.super__Vector_impl_data._M_finish = pAVar1;
    }
    skipSpace(this);
    uVar4 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  }
  else {
LAB_00b7f0eb:
    result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
    _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
    _M_payload._M_value.super_LexResult.span._M_str = (char *)_Var3;
    uVar4 = 0;
  }
  oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar4;
  oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload =
       (_Storage<unsigned_long,_true>)
       (_Storage<unsigned_long,_true>)
       result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
       ._M_payload.
       super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>._M_payload
       ._M_value.super_LexResult.span._M_str;
  return (optional<unsigned_long>)
         oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<T> Lexer::takeI() {
  static_assert(std::is_integral_v<T> && std::is_unsigned_v<T>);
  if (auto result = integer(next())) {
    if (result->isUnsigned<T>() || result->isSigned<std::make_signed_t<T>>()) {
      pos += result->span.size();
      advance();
      return T(result->n);
    }
  }
  return std::nullopt;
}